

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O3

hugeint_t __thiscall
duckdb::Hugeint::DivModPositive(Hugeint *this,hugeint_t lhs,uint64_t rhs,uint64_t *remainder)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Hugeint *pHVar4;
  Hugeint *pHVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  hugeint_t hVar12;
  
  uVar3 = lhs.upper;
  pHVar4 = (Hugeint *)lhs.lower;
  *(undefined8 *)rhs = 0;
  iVar1 = 0x80;
  pHVar5 = pHVar4;
  if ((pHVar4 == (Hugeint *)0x0) && (iVar1 = 0x40, pHVar5 = this, this == (Hugeint *)0x0)) {
    uVar2 = 0;
    uVar6 = 0;
  }
  else {
    lVar7 = 0x3f;
    if (pHVar5 != (Hugeint *)0x0) {
      for (; (ulong)pHVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar8 = (ulong)(iVar1 - ((uint)lVar7 ^ 0x3f) & 0xff);
    uVar6 = 0;
    uVar2 = 0;
    lVar7 = 0;
    do {
      uVar6 = uVar6 << 1 | uVar2 >> 0x3f;
      iVar1 = (int)uVar8;
      bVar11 = uVar8 < 0x41;
      uVar8 = uVar8 - 1;
      pHVar5 = pHVar4;
      if (bVar11) {
        pHVar5 = this;
      }
      uVar9 = (ulong)(iVar1 - 1U & 0xff);
      if (bVar11) {
        uVar9 = uVar8 & 0xffffffff;
      }
      uVar9 = (ulong)(((ulong)pHVar5 >> (uVar9 & 0x3f) & 1) != 0) + lVar7 * 2;
      uVar10 = 0;
      if (uVar3 <= uVar9) {
        uVar10 = uVar3;
      }
      lVar7 = uVar9 - uVar10;
      uVar2 = (ulong)(uVar3 <= uVar9) + uVar2 * 2;
    } while (uVar8 != 0);
    *(long *)rhs = lVar7;
  }
  hVar12.upper = uVar6;
  hVar12.lower = uVar2;
  return hVar12;
}

Assistant:

hugeint_t Hugeint::DivModPositive(hugeint_t lhs, uint64_t rhs, uint64_t &remainder) {
	D_ASSERT(lhs.upper >= 0);
	// DivMod code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// initialize the result and remainder to 0
	hugeint_t div_result;
	div_result.lower = 0;
	div_result.upper = 0;
	remainder = 0;

	uint8_t highest_bit_set = PositiveHugeintHighestBit(lhs);
	// now iterate over the amount of bits that are set in the LHS
	for (uint8_t x = highest_bit_set; x > 0; x--) {
		// left-shift the current result and remainder by 1
		div_result = PositiveHugeintLeftShift(div_result, 1);
		remainder <<= 1;
		// we get the value of the bit at position X, where position 0 is the least-significant bit
		if (PositiveHugeintIsBitSet(lhs, x - 1)) {
			// increment the remainder
			remainder++;
		}
		if (remainder >= rhs) {
			// the remainder has passed the division multiplier: add one to the divide result
			remainder -= rhs;
			div_result.lower++;
			if (div_result.lower == 0) {
				// overflow
				div_result.upper++;
			}
		}
	}
	return div_result;
}